

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::transformed_abi_cxx11_(lest *this,char chr)

{
  Tr *pTVar1;
  char cVar2;
  bool bVar3;
  allocator local_85 [20];
  allocator local_71;
  Tr **local_70;
  Tr *pos;
  Tr table [5];
  char chr_local;
  
  table[4].str._7_1_ = chr;
  memcpy(&pos,&DAT_00127c30,0x50);
  local_70 = &pos;
  while( true ) {
    if (local_70 == (Tr **)&table[4].str) {
      bVar3 = unprintable(table[4].str._7_1_);
      cVar2 = table[4].str._7_1_;
      if (bVar3) {
        to_hex_string_abi_cxx11_(this,table[4].str._7_1_);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,1,cVar2,local_85);
        std::allocator<char>::~allocator((allocator<char> *)local_85);
      }
      return this;
    }
    if (table[4].str._7_1_ == *(char *)local_70) break;
    local_70 = local_70 + 2;
  }
  pTVar1 = local_70[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,&pTVar1->chr,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return this;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}